

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O2

Type * __thiscall
soul::heart::Parser::parseArrayTypeSuffixes
          (Type *__return_storage_ptr__,Parser *this,Type *elementType)

{
  Type *pTVar1;
  bool bVar2;
  ArraySize size;
  Type local_90;
  Type local_78;
  CompileMessage local_60;
  
  bVar2 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          ::matchIf<soul::TokenType>
                    (&this->
                      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                     ,(TokenType)0x2cada8);
  if (bVar2) {
    bVar2 = Type::canBeArrayElementType(elementType);
    if (!bVar2) {
      Errors::wrongTypeForArrayElement<>();
      (*(this->
        super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
        )._vptr_Tokeniser[2])(this,&local_60);
      CompileMessage::~CompileMessage(&local_60);
    }
    bVar2 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
            ::matchIf<soul::TokenType>
                      (&this->
                        super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                       ,(TokenType)0x2a0190);
    if (bVar2) {
      Type::createUnsizedArray(&local_78,elementType);
      parseArrayTypeSuffixes(__return_storage_ptr__,this,&local_78);
      pTVar1 = &local_78;
    }
    else {
      size = parseLiteralInt(this);
      if (0x7ffffffe < size - 1) {
        Errors::illegalSize<>();
        (*(this->
          super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          )._vptr_Tokeniser[2])(this,&local_60);
        CompileMessage::~CompileMessage(&local_60);
      }
      Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
      expect<soul::TokenType>
                (&this->
                  super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                 ,(TokenType)0x2a0190);
      Type::createArray(&local_90,elementType,size);
      parseArrayTypeSuffixes(__return_storage_ptr__,this,&local_90);
      pTVar1 = &local_90;
    }
    RefCountedPtr<soul::Structure>::~RefCountedPtr(&pTVar1->structure);
  }
  else {
    Type::Type(__return_storage_ptr__,elementType);
  }
  return __return_storage_ptr__;
}

Assistant:

Type parseArrayTypeSuffixes (Type elementType)
    {
        if (matchIf (HEARTOperator::openBracket))
        {
            if (! elementType.canBeArrayElementType())
                throwError (Errors::wrongTypeForArrayElement());

            if (matchIf (HEARTOperator::closeBracket))
                return parseArrayTypeSuffixes (elementType.createUnsizedArray());

            auto size = parseLiteralInt();

            if (! Type::canBeSafelyCastToArraySize (size))
                throwError (Errors::illegalSize());

            expect (HEARTOperator::closeBracket);
            return parseArrayTypeSuffixes (elementType.createArray (static_cast<Type::ArraySize> (size)));
        }

        return elementType;
    }